

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_create.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCreate *op)

{
  PhysicalOperator *pPVar1;
  reference this_00;
  type op_00;
  NotImplementedException *this_01;
  allocator local_41;
  string local_40;
  
  switch((op->super_LogicalOperator).type) {
  case LOGICAL_CREATE_SEQUENCE:
    local_40._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    pPVar1 = Make<duckdb::PhysicalCreateSequence,duckdb::unique_ptr<duckdb::CreateSequenceInfo,std::default_delete<duckdb::CreateSequenceInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                              *)&local_40,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  case LOGICAL_CREATE_VIEW:
    local_40._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    pPVar1 = Make<duckdb::PhysicalCreateView,duckdb::unique_ptr<duckdb::CreateViewInfo,std::default_delete<duckdb::CreateViewInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                              *)&local_40,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  case LOGICAL_CREATE_SCHEMA:
    local_40._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    pPVar1 = Make<duckdb::PhysicalCreateSchema,duckdb::unique_ptr<duckdb::CreateSchemaInfo,std::default_delete<duckdb::CreateSchemaInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                              *)&local_40,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  case LOGICAL_CREATE_MACRO:
    local_40._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    pPVar1 = Make<duckdb::PhysicalCreateFunction,duckdb::unique_ptr<duckdb::CreateMacroInfo,std::default_delete<duckdb::CreateMacroInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                              *)&local_40,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unimplemented type for logical simple create",&local_41);
    NotImplementedException::NotImplementedException(this_01,&local_40);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case LOGICAL_CREATE_TYPE:
    local_40._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    pPVar1 = Make<duckdb::PhysicalCreateType,duckdb::unique_ptr<duckdb::CreateTypeInfo,std::default_delete<duckdb::CreateTypeInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                              *)&local_40,&(op->super_LogicalOperator).estimated_cardinality);
    if ((CreateInfo *)local_40._M_dataplus._M_p != (CreateInfo *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
    if ((op->super_LogicalOperator).children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (op->super_LogicalOperator).children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return pPVar1;
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    local_40._M_dataplus._M_p = (pointer)CreatePlan(this,op_00);
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar1->children,(reference_wrapper<duckdb::PhysicalOperator> *)&local_40);
    return pPVar1;
  }
  if ((CreateInfo *)local_40._M_dataplus._M_p != (CreateInfo *)0x0) {
    (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
  }
  return pPVar1;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCreate &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_CREATE_SEQUENCE:
		return Make<PhysicalCreateSequence>(unique_ptr_cast<CreateInfo, CreateSequenceInfo>(std::move(op.info)),
		                                    op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_CREATE_VIEW:
		return Make<PhysicalCreateView>(unique_ptr_cast<CreateInfo, CreateViewInfo>(std::move(op.info)),
		                                op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_CREATE_SCHEMA:
		return Make<PhysicalCreateSchema>(unique_ptr_cast<CreateInfo, CreateSchemaInfo>(std::move(op.info)),
		                                  op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_CREATE_MACRO:
		return Make<PhysicalCreateFunction>(unique_ptr_cast<CreateInfo, CreateMacroInfo>(std::move(op.info)),
		                                    op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_CREATE_TYPE: {
		auto &create = Make<PhysicalCreateType>(unique_ptr_cast<CreateInfo, CreateTypeInfo>(std::move(op.info)),
		                                        op.estimated_cardinality);
		if (!op.children.empty()) {
			D_ASSERT(op.children.size() == 1);
			auto &plan = CreatePlan(*op.children[0]);
			create.children.push_back(plan);
		}
		return create;
	}
	default:
		throw NotImplementedException("Unimplemented type for logical simple create");
	}
}